

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Cmd::nextLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cmd *this,bool mask_mode)

{
  undefined8 *puVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char buf [4096];
  undefined8 uStack_1030;
  string local_1028 [128];
  
  uStack_1030 = 0x102d4f;
  iVar4 = isatty(this->in_fd_);
  if (iVar4 == 0) {
    uStack_1030 = 0x102df0;
    readlineNoTTY_abi_cxx11_(local_1028,this);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1028[0]._M_dataplus._M_p == &local_1028[0].field_2) {
      *puVar1 = CONCAT71(local_1028[0].field_2._M_allocated_capacity._1_7_,
                         local_1028[0].field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload + 0x18) = local_1028[0].field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = local_1028[0]._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10) =
           CONCAT71(local_1028[0].field_2._M_allocated_capacity._1_7_,
                    local_1028[0].field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = local_1028[0]._M_string_length;
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
  }
  else {
    uStack_1030 = 0x102d5c;
    bVar3 = isUnsupportedTerm();
    if (bVar3) {
      uStack_1030 = 0x102d74;
      write(this->out_fd_,(this->prompt)._M_dataplus._M_p,(this->prompt)._M_string_length);
      uStack_1030 = 0x102d7d;
      fflush((FILE *)this->out_);
      uStack_1030 = 0x102d8e;
      pcVar5 = fgets((char *)local_1028,0x1000,(FILE *)this->in_);
      if (pcVar5 == (char *)0x0) {
        bVar3 = false;
      }
      else {
        uStack_1030 = 0x102d9f;
        for (sVar6 = strlen((char *)local_1028);
            (sVar6 != 0 &&
            ((cVar2 = *(char *)((long)&uStack_1030 + sVar6 + 7), cVar2 == '\r' || (cVar2 == '\n'))))
            ; sVar6 = sVar6 - 1) {
          *(undefined1 *)((long)&uStack_1030 + sVar6 + 7) = 0;
        }
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (pointer)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10);
        uStack_1030 = 0x102dcf;
        sVar6 = strlen((char *)local_1028);
        uStack_1030 = 0x102dde;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,local_1028,
                   (long)&local_1028[0]._M_dataplus._M_p + sVar6);
        bVar3 = true;
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = bVar3;
    }
    else {
      uStack_1030 = 0x102e21;
      readlineRaw_abi_cxx11_(__return_storage_ptr__,this,mask_mode);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> nextLine(bool mask_mode = false) {
		if (!isatty(in_fd_)) {
			// Not a tty: read from file / pipe.
			return readlineNoTTY();
		} else if (isUnsupportedTerm()) {

			write_string(prompt);
			fflush(out_);

			char buf[MaxLineLength];
			if (fgets(buf, sizeof(buf), in_) == nullptr) {
				return {};
			}

			size_t len = strlen(buf);
			while (len != 0 && (buf[len - 1] == '\n' || buf[len - 1] == '\r')) {
				buf[--len] = '\0';
			}

			return buf;
		} else {
			return readlineRaw(mask_mode);
		}
	}